

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

string * __thiscall
dpfb::unicode::utf16ToUtf8_abi_cxx11_
          (string *__return_storage_ptr__,unicode *this,char16_t *begin,char16_t *end)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  byte *pbVar5;
  unicode *puVar6;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this < begin) {
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    lVar2 = 0;
    do {
      puVar6 = this + 2;
      uVar4 = (uint)(ushort)*(char16_t *)this;
      if (puVar6 < begin && (uVar4 & 0xfc00) == 0xd800) {
        puVar6 = this + 4;
        if (((ushort)*(char16_t *)(this + 2) & 0xfc00) == 0xdc00) {
          uVar4 = ((ushort)*(char16_t *)this & 0x3ff) * 0x400 +
                  ((ushort)*(char16_t *)(this + 2) & 0x3ff) + 0x10000;
        }
      }
      iVar1 = 1;
      if ((0x7f < uVar4) && (iVar1 = 2, 0x7ff < uVar4)) {
        if ((uVar4 & 0x1ff800) == 0xd800) {
          iVar1 = (int)replacementCharacterUtf8_abi_cxx11_._8_8_;
        }
        else {
          iVar1 = 4 - (uint)(uVar4 < 0x10000);
        }
      }
      std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)(iVar1 + lVar2));
      pbVar5 = (byte *)((__return_storage_ptr__->_M_dataplus)._M_p + lVar2);
      bVar3 = (byte)uVar4;
      if (uVar4 < 0x80) {
        *pbVar5 = bVar3;
      }
      else if (uVar4 < 0x800) {
        *pbVar5 = (byte)(uVar4 >> 6) | 0xc0;
        pbVar5[1] = bVar3 & 0x3f | 0x80;
      }
      else if ((uVar4 & 0x1ff800) == 0xd800) {
        std::__cxx11::string::copy
                  (replacementCharacterUtf8_abi_cxx11_,(ulong)pbVar5,
                   replacementCharacterUtf8_abi_cxx11_._8_8_);
      }
      else if (uVar4 < 0x10000) {
        *pbVar5 = (byte)(uVar4 >> 0xc) | 0xe0;
        pbVar5[1] = (byte)(uVar4 >> 6) & 0x3f | 0x80;
        pbVar5[2] = bVar3 & 0x3f | 0x80;
      }
      else {
        *pbVar5 = (byte)(uVar4 >> 0x12) | 0xf0;
        pbVar5[1] = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
        pbVar5[2] = (byte)(uVar4 >> 6) & 0x3f | 0x80;
        pbVar5[3] = bVar3 & 0x3f | 0x80;
      }
      lVar2 = iVar1 + lVar2;
      this = puVar6;
    } while (puVar6 < begin);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string utf16ToUtf8(const char16_t* begin, const char16_t* end)
{
    std::string result;
    std::size_t resultLen = 0;

    if (begin < end)
        result.reserve(end - begin);

    while (begin < end) {
        char32_t cp = *begin++;
        // A lone surrogate is handled by utf8Length() and
        // encodeUtf8(), so we don't have to set cp to replacement
        // character.
        if (isLeadingSurrogate(cp) && begin < end) {
            const char32_t cp2 = *begin++;
            if (isTrailingSurrogate(cp2))
                cp = combineSurrogates(cp, cp2);
        }

        const auto seqIdx = resultLen;
        resultLen += utf8Length(cp);
        result.resize(resultLen);
        encodeUtf8(cp, &result[seqIdx]);
    }

    return result;
}